

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

UnqualifiedName * __thiscall soul::StructuralParser::parseUnqualifiedName(StructuralParser *this)

{
  char *pcVar1;
  UnqualifiedName *pUVar2;
  Identifier identifier;
  Context context;
  Identifier local_68;
  Context local_60;
  CompileMessage local_48;
  
  local_60.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_60.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_60.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_60.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_60.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_60.parentScope = this->currentScope;
  local_68 = parseIdentifierWithMaxLength(this,0x80);
  pcVar1 = (this->super_SOULTokeniser).currentType.text;
  if ((pcVar1 == "::") ||
     ((((pcVar1 != (char *)0x0 && (*pcVar1 == ':')) && (pcVar1[1] == ':')) && (pcVar1[2] == '\0'))))
  {
    CompileMessageHelpers::createMessage<>
              (&local_48,syntax,error,"This identifier cannot have a namespace qualifier");
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_48);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_48.location.sourceCode.object);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.description._M_dataplus._M_p != &local_48.description.field_2) {
      operator_delete(local_48.description._M_dataplus._M_p,
                      local_48.description.field_2._M_allocated_capacity + 1);
    }
  }
  pUVar2 = PoolAllocator::allocate<soul::AST::UnqualifiedName,soul::AST::Context&,soul::Identifier&>
                     (&this->allocator->pool,&local_60,&local_68);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_60.location.sourceCode.object);
  return pUVar2;
}

Assistant:

AST::UnqualifiedName& parseUnqualifiedName()
    {
        auto context = getContext();
        auto identifier = parseIdentifierWithMaxLength (AST::maxIdentifierLength);

        if (matches (Operator::doubleColon))
            throwError (Errors::identifierMustBeUnqualified());

        return allocate<AST::UnqualifiedName> (context, identifier);
    }